

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *pTVar1;
  TestResult *pTVar2;
  ostream *poVar3;
  internal *piVar4;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t extraout_RDX;
  size_t width_01;
  size_t width_02;
  size_t width_03;
  size_t width_04;
  TimeInMillis ms;
  size_t width_05;
  TimeInMillis ms_00;
  size_t width_06;
  size_t extraout_RDX_00;
  size_t width_07;
  size_t width_08;
  size_t width_09;
  size_t width_10;
  size_t width_11;
  TimeInMillis ms_01;
  size_t width_12;
  TimeInMillis ms_02;
  size_t width_13;
  size_t width_14;
  size_t width_15;
  size_t width_16;
  size_t width_17;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  allocator local_7c9;
  string local_7c8;
  allocator local_7a1;
  string local_7a0;
  allocator local_779;
  string local_778;
  string local_758;
  string local_738;
  allocator local_711;
  string local_710;
  allocator local_6e9;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  allocator local_681;
  string local_680;
  allocator local_659;
  string local_658;
  string local_638;
  allocator local_611;
  string local_610;
  allocator local_5e9;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  string local_5a0;
  allocator local_579;
  string local_578;
  allocator local_551;
  string local_550;
  allocator local_529;
  string local_528;
  string local_508;
  allocator local_4e1;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  string local_3a0;
  string local_380;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  string local_38;
  TestResult *local_18;
  TestResult *result_local;
  ostream *stream_local;
  
  local_18 = result;
  result_local = (TestResult *)stream;
  Indent_abi_cxx11_(&local_38,(internal *)0x4,in_RDX);
  poVar3 = std::operator<<(stream,(string *)&local_38);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"testsuite",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"name",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"NonTestSuiteFailure",&local_b9);
  Indent_abi_cxx11_(&local_e0,(internal *)0x6,width);
  OutputJsonKey((ostream *)pTVar1,&local_68,&local_90,&local_b8,&local_e0,true);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"testsuite",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"tests",&local_129);
  Indent_abi_cxx11_(&local_150,(internal *)0x6,width_00);
  OutputJsonKey((ostream *)pTVar1,&local_100,&local_128,1,&local_150,true);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  pTVar1 = result_local;
  width_07 = extraout_RDX;
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"testsuite",&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"failures",&local_199);
    Indent_abi_cxx11_(&local_1c0,(internal *)0x6,width_01);
    OutputJsonKey((ostream *)pTVar1,&local_170,&local_198,1,&local_1c0,true);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"testsuite",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"disabled",&local_209);
    Indent_abi_cxx11_(&local_230,(internal *)0x6,width_02);
    OutputJsonKey((ostream *)pTVar1,&local_1e0,&local_208,0,&local_230,true);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"testsuite",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"skipped",&local_279);
    Indent_abi_cxx11_(&local_2a0,(internal *)0x6,width_03);
    OutputJsonKey((ostream *)pTVar1,&local_250,&local_278,0,&local_2a0,true);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c0,"testsuite",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,"errors",&local_2e9);
    Indent_abi_cxx11_(&local_310,(internal *)0x6,width_04);
    OutputJsonKey((ostream *)pTVar1,&local_2c0,&local_2e8,0,&local_310,true);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_330,"testsuite",&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_358,"time",&local_359);
    piVar4 = (internal *)TestResult::elapsed_time(local_18);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_380,piVar4,ms);
    Indent_abi_cxx11_(&local_3a0,(internal *)0x6,width_05);
    OutputJsonKey((ostream *)pTVar1,&local_330,&local_358,&local_380,&local_3a0,true);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    std::__cxx11::string::~string((string *)&local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    pTVar1 = result_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c0,"testsuite",&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e8,"timestamp",&local_3e9);
    piVar4 = (internal *)TestResult::start_timestamp(local_18);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_410,piVar4,ms_00);
    Indent_abi_cxx11_(&local_430,(internal *)0x6,width_06);
    OutputJsonKey((ostream *)pTVar1,&local_3c0,&local_3e8,&local_410,&local_430,true);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    width_07 = extraout_RDX_00;
  }
  pTVar1 = result_local;
  Indent_abi_cxx11_(&local_450,(internal *)0x6,width_07);
  poVar3 = std::operator<<((ostream *)pTVar1,(string *)&local_450);
  std::operator<<(poVar3,"\"testsuite\": [\n");
  std::__cxx11::string::~string((string *)&local_450);
  pTVar1 = result_local;
  Indent_abi_cxx11_(&local_470,(internal *)0x8,width_08);
  poVar3 = std::operator<<((ostream *)pTVar1,(string *)&local_470);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_470);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"testcase",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"name",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"",&local_4e1);
  Indent_abi_cxx11_(&local_508,(internal *)0xa,width_09);
  OutputJsonKey((ostream *)pTVar1,&local_490,&local_4b8,&local_4e0,&local_508,true);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_528,"testcase",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"status",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"RUN",&local_579);
  Indent_abi_cxx11_(&local_5a0,(internal *)0xa,width_10);
  OutputJsonKey((ostream *)pTVar1,&local_528,&local_550,&local_578,&local_5a0,true);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"testcase",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e8,"result",&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_610,"COMPLETED",&local_611);
  Indent_abi_cxx11_(&local_638,(internal *)0xa,width_11);
  OutputJsonKey((ostream *)pTVar1,&local_5c0,&local_5e8,&local_610,&local_638,true);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_658,"testcase",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_680,"timestamp",&local_681);
  piVar4 = (internal *)TestResult::start_timestamp(local_18);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_6a8,piVar4,ms_01);
  Indent_abi_cxx11_(&local_6c8,(internal *)0xa,width_12);
  OutputJsonKey((ostream *)pTVar1,&local_658,&local_680,&local_6a8,&local_6c8,true);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e8,"testcase",&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_710,"time",&local_711);
  piVar4 = (internal *)TestResult::elapsed_time(local_18);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_738,piVar4,ms_02);
  Indent_abi_cxx11_(&local_758,(internal *)0xa,width_13);
  OutputJsonKey((ostream *)pTVar1,&local_6e8,&local_710,&local_738,&local_758,true);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_778,"testcase",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a0,"classname",&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c8,"",&local_7c9);
  Indent_abi_cxx11_(&local_7f0,(internal *)0xa,width_14);
  OutputJsonKey((ostream *)pTVar1,&local_778,&local_7a0,&local_7c8,&local_7f0,false);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  pTVar2 = result_local;
  pTVar1 = local_18;
  Indent_abi_cxx11_(&local_830,(internal *)0xa,width_15);
  TestPropertiesAsJson(&local_810,pTVar1,&local_830);
  std::operator<<((ostream *)pTVar2,(string *)&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_830);
  OutputJsonTestResult((ostream *)result_local,local_18);
  poVar3 = std::operator<<((ostream *)result_local,"\n");
  Indent_abi_cxx11_(&local_850,(internal *)0x6,width_16);
  poVar3 = std::operator<<(poVar3,(string *)&local_850);
  poVar3 = std::operator<<(poVar3,"]\n");
  Indent_abi_cxx11_(&local_870,(internal *)0x4,width_17);
  poVar3 = std::operator<<(poVar3,(string *)&local_870);
  std::operator<<(poVar3,"}");
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_850);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}